

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapInfoHeader::get
          (BitmapInfoHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d354);
  set_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x13d36c);
  set_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x13d384);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d39c);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d3b4);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d3cc);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d3e4);
  set_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x13d3fc);
  set_value<int>(in_RDI,in_stack_ffffffffffffffd8,(int *)0x13d414);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d42c);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d444);
  return;
}

Assistant:

void get( std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            set_value( data, offset, biSize );
            set_value( data, offset, biWidth );
            set_value( data, offset, biHeight );
            set_value( data, offset, biPlanes );
            set_value( data, offset, biBitCount );
            set_value( data, offset, biCompress );
            set_value( data, offset, biSizeImage );
            set_value( data, offset, biXPelsPerMeter );
            set_value( data, offset, biYPelsPerMeter );
            set_value( data, offset, biClrUsed );
            set_value( data, offset, biClrImportant );
        }